

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O2

bool __thiscall Assimp::D3MF::D3MFExporter::exportRelations(D3MFExporter *this)

{
  ostringstream *poVar1;
  pointer ppOVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t i;
  ulong uVar5;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  poVar1 = &this->mRelOutput;
  std::ios::clear((int)*(undefined8 *)(*(long *)&this->mRelOutput + -0x18) + (int)poVar1);
  std::operator<<((ostream *)poVar1,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>");
  std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "<Relationships xmlns=\"http://schemas.openxmlformats.org/package/2006/relationships\">"
                 );
  for (uVar5 = 0;
      ppOVar2 = (this->mRelations).
                super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->mRelations).
                            super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar2 >> 3);
      uVar5 = uVar5 + 1) {
    pcVar4 = "<Relationship Target=\"";
    if (*(ppOVar2[uVar5]->target)._M_dataplus._M_p != '/') {
      pcVar4 = "<Relationship Target=\"/";
    }
    poVar3 = std::operator<<((ostream *)poVar1,pcVar4);
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->mRelations).
                                     super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar5]->target);
    std::operator<<(poVar3,"\" ");
    poVar3 = std::operator<<((ostream *)poVar1,"Id=\"");
    poVar3 = std::operator<<(poVar3,(string *)
                                    (this->mRelations).
                                    super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar5]);
    std::operator<<(poVar3,"\" ");
    poVar3 = std::operator<<((ostream *)poVar1,"Type=\"");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->mRelations).
                                     super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar5]->type);
    std::operator<<(poVar3,"\" />");
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  }
  std::operator<<((ostream *)poVar1,"</Relationships>");
  std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"_rels",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,".rels",&local_72);
  writeRelInfoToFile(this,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::ostream::flush();
  return true;
}

Assistant:

bool D3MFExporter::exportRelations() {
    mRelOutput.clear();

    mRelOutput << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>";
    mRelOutput << std::endl;
    mRelOutput << "<Relationships xmlns=\"http://schemas.openxmlformats.org/package/2006/relationships\">";

    for ( size_t i = 0; i < mRelations.size(); ++i ) {
        if ( mRelations[ i ]->target[ 0 ] == '/' ) {
            mRelOutput << "<Relationship Target=\"" << mRelations[ i ]->target << "\" ";
        } else {
            mRelOutput << "<Relationship Target=\"/" << mRelations[ i ]->target << "\" ";
        }
        mRelOutput << "Id=\"" << mRelations[i]->id << "\" ";
        mRelOutput << "Type=\"" << mRelations[ i ]->type << "\" />";
        mRelOutput << std::endl;
    }
    mRelOutput << "</Relationships>";
    mRelOutput << std::endl;

    writeRelInfoToFile( "_rels", ".rels" );
    mRelOutput.flush();

    return true;
}